

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2shape_index.cc
# Opt level: O1

bool __thiscall S2ShapeIndexCell::Decode(S2ShapeIndexCell *this,int num_shape_ids,Decoder *decoder)

{
  byte bVar1;
  byte *pbVar2;
  byte *pbVar3;
  int iVar4;
  bool bVar5;
  uint in_EAX;
  reference pvVar6;
  uchar *puVar7;
  int32 *piVar8;
  byte *pbVar9;
  uchar *limit;
  long lVar10;
  ulong uVar11;
  anon_union_8_2_2d159a09_for_S2ClippedShape_3 *paVar12;
  uint uVar13;
  uint uVar14;
  long lVar15;
  int *piVar16;
  uint uVar17;
  ulong uVar18;
  int iVar19;
  uint uVar20;
  int num_edges;
  uint64 header;
  uint local_54;
  S2LogMessage local_40;
  
  if (num_shape_ids == 1) {
    uVar20 = *(uint *)&(this->shapes_).
                       super_compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_> &
             0xffffff;
    gtl::compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_>::resize
              ((compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_> *)this,
               uVar20 + 1);
    pvVar6 = gtl::compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_>::operator[]
                       ((compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_> *)this,
                        uVar20);
    puVar7 = (uchar *)Varint::Parse64WithLimit
                                ((char *)decoder->buf_,(char *)decoder->limit_,(uint64 *)&local_40);
    if (puVar7 == (uchar *)0x0) {
      return false;
    }
    decoder->buf_ = puVar7;
    if ((local_40._0_8_ & 1) == 0) {
      pvVar6->shape_id_ = 0;
      uVar20 = (uint)((ulong)local_40._0_8_ >> 2) & 0xf;
      *(uint *)&pvVar6->field_0x4 = uVar20 * 2 + 4;
      if (((ulong)local_40._0_8_ >> 2 & 0xf) != 0) {
        piVar8 = (int32 *)operator_new__((ulong)((uVar20 + 2) * 4));
        (pvVar6->field_3).edges_ = piVar8;
      }
      *(uint *)&pvVar6->field_0x4 =
           *(uint *)&pvVar6->field_0x4 & 0xfffffffe | (uint)((ulong)local_40._0_8_ >> 1) & 1;
      uVar18 = (ulong)local_40._0_8_ >> 6;
      lVar10 = 0;
      do {
        paVar12 = &pvVar6->field_3;
        if (5 < *(uint *)&pvVar6->field_0x4) {
          paVar12 = (anon_union_8_2_2d159a09_for_S2ClippedShape_3 *)(pvVar6->field_3).edges_;
        }
        *(int *)((long)paVar12 + lVar10) = (int)uVar18;
        uVar18 = (ulong)((int)uVar18 + 1);
        lVar10 = lVar10 + 4;
      } while ((ulong)uVar20 * 4 + 8 != lVar10);
      return true;
    }
    if ((local_40._0_8_ & 2) == 0) {
      pvVar6->shape_id_ = 0;
      *(uint *)&pvVar6->field_0x4 = (uint)((ulong)local_40._0_8_ >> 2) & 1 | 2;
      (pvVar6->field_3).inline_edges_._M_elems[0] = (int)((ulong)local_40._0_8_ >> 3);
      return true;
    }
    pvVar6->shape_id_ = 0;
    iVar19 = (int)((ulong)local_40._0_8_ >> 3);
    *(int *)&pvVar6->field_0x4 = iVar19 * 2;
    if (5 < (uint)(iVar19 * 2)) {
      uVar18 = 0xffffffffffffffff;
      if (-1 < iVar19) {
        uVar18 = (long)iVar19 << 2;
      }
      piVar8 = (int32 *)operator_new__(uVar18);
      (pvVar6->field_3).edges_ = piVar8;
    }
    *(uint *)&pvVar6->field_0x4 =
         *(uint *)&pvVar6->field_0x4 & 0xfffffffe | local_40.severity_ >> 2 & 1;
    bVar5 = DecodeEdges(iVar19,pvVar6,decoder);
    return bVar5;
  }
  pbVar2 = decoder->buf_;
  pbVar3 = decoder->limit_;
  if (pbVar2 < pbVar3) {
    in_EAX = *pbVar2 & 0x7f;
    pbVar9 = pbVar2 + 1;
    if ((char)*pbVar2 < '\0') {
      if (pbVar3 <= pbVar2 + 1) goto LAB_00224422;
      in_EAX = in_EAX | (pbVar2[1] & 0x7f) << 7;
      pbVar9 = pbVar2 + 2;
      if ((char)pbVar2[1] < '\0') {
        if (pbVar3 <= pbVar2 + 2) goto LAB_00224422;
        in_EAX = in_EAX | (pbVar2[2] & 0x7f) << 0xe;
        pbVar9 = pbVar2 + 3;
        if ((char)pbVar2[2] < '\0') {
          if (pbVar3 <= pbVar2 + 3) goto LAB_00224422;
          in_EAX = in_EAX | (pbVar2[3] & 0x7f) << 0x15;
          pbVar9 = pbVar2 + 4;
          if ((char)pbVar2[3] < '\0') {
            if (pbVar3 <= pbVar2 + 4) goto LAB_00224422;
            in_EAX = in_EAX | (uint)pbVar2[4] << 0x1c;
            pbVar9 = (byte *)0x0;
            if (pbVar2[4] < 0x10) {
              pbVar9 = pbVar2 + 5;
            }
          }
        }
      }
    }
  }
  else {
LAB_00224422:
    pbVar9 = (byte *)0x0;
  }
  if (pbVar9 == (byte *)0x0) {
    return false;
  }
  decoder->buf_ = pbVar9;
  uVar20 = 1;
  if ((in_EAX & 7) != 3) goto LAB_00224546;
  pbVar2 = decoder->buf_;
  if (pbVar2 < pbVar3) {
    uVar17 = *pbVar2 & 0x7f;
    pbVar9 = pbVar2 + 1;
    if ((char)*pbVar2 < '\0') {
      if (pbVar3 <= pbVar2 + 1) goto LAB_0022452c;
      uVar17 = uVar17 | (pbVar2[1] & 0x7f) << 7;
      pbVar9 = pbVar2 + 2;
      if ((char)pbVar2[1] < '\0') {
        if (pbVar3 <= pbVar2 + 2) goto LAB_0022452c;
        uVar17 = uVar17 | (pbVar2[2] & 0x7f) << 0xe;
        pbVar9 = pbVar2 + 3;
        if ((char)pbVar2[2] < '\0') {
          if (pbVar3 <= pbVar2 + 3) goto LAB_0022452c;
          uVar20 = uVar17 | (pbVar2[3] & 0x7f) << 0x15;
          pbVar9 = pbVar2 + 4;
          uVar17 = uVar20;
          if ((char)pbVar2[3] < '\0') {
            if (pbVar3 <= pbVar2 + 4) goto LAB_0022452c;
            pbVar9 = (byte *)0x0;
            uVar17 = in_EAX;
            if (pbVar2[4] < 0x10) {
              pbVar9 = pbVar2 + 5;
              uVar17 = (uint)pbVar2[4] << 0x1c | uVar20;
            }
          }
        }
      }
    }
  }
  else {
LAB_0022452c:
    pbVar9 = (byte *)0x0;
    uVar17 = in_EAX;
  }
  if (pbVar9 == (byte *)0x0) {
    return false;
  }
  uVar20 = in_EAX >> 3;
  decoder->buf_ = pbVar9;
  in_EAX = uVar17;
LAB_00224546:
  uVar18 = (ulong)in_EAX;
  uVar17 = *(uint *)&(this->shapes_).
                     super_compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_> &
           0xffffff;
  gtl::compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_>::resize
            ((compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_> *)this,
             uVar20 + uVar17);
  pvVar6 = gtl::compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_>::operator[]
                     ((compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_> *)this,
                      uVar17);
  if (uVar20 == 0) {
    return uVar20 == 0;
  }
  iVar19 = 0;
  uVar17 = 0;
  do {
    if (uVar17 != 0) {
      pbVar2 = decoder->buf_;
      pbVar3 = decoder->limit_;
      if (pbVar2 < pbVar3) {
        pbVar9 = pbVar2 + 1;
        uVar13 = *pbVar2 & 0x7f;
        if ((char)*pbVar2 < '\0') {
          if (pbVar9 < pbVar3) {
            pbVar9 = pbVar2 + 2;
            uVar13 = (pbVar2[1] & 0x7f) << 7 | uVar13;
            if (-1 < (char)pbVar2[1]) {
LAB_002245e1:
              uVar18 = (ulong)uVar13;
              goto LAB_0022464c;
            }
            if (pbVar9 < pbVar3) {
              pbVar9 = pbVar2 + 3;
              uVar13 = (pbVar2[2] & 0x7f) << 0xe | uVar13;
              if (-1 < (char)pbVar2[2]) goto LAB_002245b7;
              if (pbVar9 < pbVar3) {
                pbVar9 = pbVar2 + 4;
                uVar13 = (pbVar2[3] & 0x7f) << 0x15 | uVar13;
                if (-1 < (char)pbVar2[3]) goto LAB_002245e1;
                if (pbVar9 < pbVar3) {
                  pbVar9 = pbVar2 + 5;
                  if (pbVar2[4] < 0x10) {
                    uVar18 = (ulong)((uint)pbVar2[4] << 0x1c | uVar13);
                  }
                  else {
                    pbVar9 = (byte *)0x0;
                  }
                  goto LAB_0022464c;
                }
              }
            }
          }
          goto LAB_0022464a;
        }
LAB_002245b7:
        uVar18 = (ulong)uVar13;
      }
      else {
LAB_0022464a:
        pbVar9 = (byte *)0x0;
      }
LAB_0022464c:
      if (pbVar9 == (byte *)0x0) {
        return false;
      }
      decoder->buf_ = pbVar9;
    }
    uVar13 = (uint)uVar18;
    if ((uVar18 & 1) == 0) {
      pbVar2 = decoder->buf_;
      pbVar3 = decoder->limit_;
      if (pbVar2 < pbVar3) {
        pbVar9 = pbVar2 + 1;
        uVar13 = *pbVar2 & 0x7f;
        uVar11 = (ulong)uVar13;
        if ((char)*pbVar2 < '\0') {
          if (pbVar9 < pbVar3) {
            pbVar9 = pbVar2 + 2;
            uVar13 = (pbVar2[1] & 0x7f) << 7 | uVar13;
            if (-1 < (char)pbVar2[1]) {
LAB_002246a8:
              uVar11 = (ulong)uVar13;
              goto LAB_002247a8;
            }
            if (pbVar9 < pbVar3) {
              pbVar9 = pbVar2 + 3;
              uVar13 = (pbVar2[2] & 0x7f) << 0xe | uVar13;
              uVar11 = (ulong)uVar13;
              if (-1 < (char)pbVar2[2]) goto LAB_002247a8;
              if (pbVar9 < pbVar3) {
                pbVar9 = pbVar2 + 4;
                uVar13 = (pbVar2[3] & 0x7f) << 0x15 | uVar13;
                if (-1 < (char)pbVar2[3]) goto LAB_002246a8;
                if (pbVar9 < pbVar3) {
                  bVar1 = pbVar2[4];
                  pbVar9 = pbVar2 + 5;
                  uVar13 = (uint)bVar1 << 0x1c | uVar13;
                  if (0xf < bVar1) {
                    uVar13 = 0;
                  }
                  uVar11 = (ulong)uVar13;
                  if (0xf < bVar1) {
                    pbVar9 = (byte *)0x0;
                  }
                  goto LAB_002247a8;
                }
              }
            }
          }
          goto LAB_002247a3;
        }
      }
      else {
LAB_002247a3:
        uVar11 = 0;
        pbVar9 = (byte *)0x0;
      }
LAB_002247a8:
      if (pbVar9 != (byte *)0x0) {
        decoder->buf_ = pbVar9;
        iVar19 = iVar19 + (int)(uVar11 >> 4);
        uVar13 = (uint)uVar11 & 0xf;
        pvVar6->shape_id_ = iVar19;
        *(uint *)&pvVar6->field_0x4 = uVar13 * 2 + 2;
        if (1 < uVar13) {
          piVar8 = (int32 *)operator_new__((ulong)((uVar13 + 1) * 4));
          (pvVar6->field_3).edges_ = piVar8;
        }
        *(uint *)&pvVar6->field_0x4 =
             *(uint *)&pvVar6->field_0x4 & 0xfffffffe | (uint)(uVar18 >> 1) & 1;
        uVar11 = uVar18 >> 2;
        lVar10 = 0;
        lVar15 = 0;
        do {
          if (*(uint *)&pvVar6->field_0x4 < 6) {
            piVar16 = (int *)((long)&pvVar6->field_3 + lVar15 * 4);
          }
          else {
            piVar16 = (int *)((long)(pvVar6->field_3).edges_ + lVar10);
          }
          *piVar16 = (int)uVar11;
          lVar15 = lVar15 + 1;
          uVar11 = (ulong)((int)uVar11 + 1);
          lVar10 = lVar10 + 4;
        } while ((ulong)uVar13 * 4 + 4 != lVar10);
      }
      if (pbVar9 == (byte *)0x0) {
        return false;
      }
    }
    else if ((~uVar13 & 7) == 0) {
      iVar19 = iVar19 + (int)(uVar18 >> 4);
      pvVar6->shape_id_ = iVar19;
      *(uint *)&pvVar6->field_0x4 = (uint)(uVar18 >> 3) & 1;
    }
    else {
      if ((uVar13 & 3) != 1) {
        S2LogMessage::S2LogMessage
                  (&local_40,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2shape_index.cc"
                   ,0xf1,kFatal,(ostream *)&std::cerr);
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_40.stream_,"Check failed: (header & 3) == (1) ",0x22);
        abort();
      }
      pbVar2 = decoder->buf_;
      pbVar3 = decoder->limit_;
      if (pbVar2 < pbVar3) {
        pbVar9 = pbVar2 + 1;
        uVar14 = *pbVar2 & 0x7f;
        if ((char)*pbVar2 < '\0') {
          if (pbVar3 <= pbVar9) goto LAB_002248c3;
          pbVar9 = pbVar2 + 2;
          uVar14 = (pbVar2[1] & 0x7f) << 7 | uVar14;
          if ((char)pbVar2[1] < '\0') {
            if (pbVar3 <= pbVar9) goto LAB_002248c3;
            pbVar9 = pbVar2 + 3;
            uVar14 = (pbVar2[2] & 0x7f) << 0xe | uVar14;
            if ((char)pbVar2[2] < '\0') {
              if (pbVar3 <= pbVar9) goto LAB_002248c3;
              pbVar9 = pbVar2 + 4;
              uVar14 = (pbVar2[3] & 0x7f) << 0x15 | uVar14;
              if ((char)pbVar2[3] < '\0') {
                if (pbVar3 <= pbVar9) goto LAB_002248c3;
                pbVar9 = pbVar2 + 5;
                uVar14 = (uint)pbVar2[4] << 0x1c | uVar14;
                if (0xf < pbVar2[4]) {
                  pbVar9 = (byte *)0x0;
                  uVar14 = local_54;
                }
              }
            }
          }
        }
      }
      else {
LAB_002248c3:
        pbVar9 = (byte *)0x0;
        uVar14 = local_54;
      }
      local_54 = uVar14;
      if (pbVar9 == (byte *)0x0) {
        bVar5 = false;
      }
      else {
        decoder->buf_ = pbVar9;
        iVar19 = iVar19 + local_54;
        pvVar6->shape_id_ = iVar19;
        iVar4 = (int)(uVar18 >> 3);
        num_edges = iVar4 + 1;
        *(int *)&pvVar6->field_0x4 = iVar4 * 2 + 2;
        if (0xf < uVar13) {
          piVar8 = (int32 *)operator_new__((ulong)(uint)(num_edges * 4));
          (pvVar6->field_3).edges_ = piVar8;
        }
        *(uint *)&pvVar6->field_0x4 =
             *(uint *)&pvVar6->field_0x4 & 0xfffffffe | (uint)(uVar18 >> 2) & 1;
        bVar5 = DecodeEdges(num_edges,pvVar6,decoder);
      }
      if (bVar5 == false) {
        return false;
      }
    }
    uVar17 = uVar17 + 1;
    pvVar6 = pvVar6 + 1;
    iVar19 = iVar19 + 1;
    if (uVar17 == uVar20) {
      return true;
    }
  } while( true );
}

Assistant:

bool S2ShapeIndexCell::Decode(int num_shape_ids, Decoder* decoder) {
  // This function inverts the encodings documented above.
  if (num_shape_ids == 1) {
    // Entire S2ShapeIndex contains only one shape.
    S2ClippedShape* clipped = add_shapes(1);
    uint64 header;
    if (!decoder->get_varint64(&header)) return false;
    if ((header & 1) == 0) {
      // The cell contains a contiguous range of edges.
      int num_edges = ((header >> 2) & 15) + 2;
      clipped->Init(0 /*shape_id*/, num_edges);
      clipped->set_contains_center((header & 2) != 0);
      for (int i = 0, edge_id = header >> 6; i < num_edges; ++i) {
        clipped->set_edge(i, edge_id + i);
      }
      return true;
    }
    if ((header & 2) == 0) {
      // The cell contains a single edge.
      clipped->Init(0 /*shape_id*/, 1 /*num_edges*/);
      clipped->set_contains_center((header & 4) != 0);
      clipped->set_edge(0, header >> 3);
      return true;
    }
    // The cell contains some other combination of edges.
    int num_edges = header >> 3;
    clipped->Init(0 /*shape_id*/, num_edges);
    clipped->set_contains_center((header & 4) != 0);
    return DecodeEdges(num_edges, clipped, decoder);
  }
  // S2ShapeIndex contains more than one shape.
  uint32 header;
  if (!decoder->get_varint32(&header)) return false;
  int num_clipped = 1;
  if ((header & 7) == 3) {
    // This cell contains more than one shape.
    num_clipped = header >> 3;
    if (!decoder->get_varint32(&header)) return false;
  }
  int shape_id = 0;
  S2ClippedShape* clipped = add_shapes(num_clipped);
  for (int j = 0; j < num_clipped; ++j, ++clipped, ++shape_id) {
    if (j > 0 && !decoder->get_varint32(&header)) return false;
    if ((header & 1) == 0) {
      // The clipped shape contains a contiguous range of edges.
      uint32 shape_id_count = 0;
      if (!decoder->get_varint32(&shape_id_count)) return false;
      shape_id += shape_id_count >> 4;
      int num_edges = (shape_id_count & 15) + 1;
      clipped->Init(shape_id, num_edges);
      clipped->set_contains_center((header & 2) != 0);
      for (int i = 0, edge_id = header >> 2; i < num_edges; ++i) {
        clipped->set_edge(i, edge_id + i);
      }
    } else if ((header & 7) == 7) {
      // The clipped shape has no edges.
      shape_id += header >> 4;
      clipped->Init(shape_id, 0);
      clipped->set_contains_center((header & 8) != 0);
    } else {
      // The clipped shape contains some other combination of edges.
      S2_DCHECK_EQ(header & 3, 1);
      uint32 shape_delta;
      if (!decoder->get_varint32(&shape_delta)) return false;
      shape_id += shape_delta;
      int num_edges = (header >> 3) + 1;
      clipped->Init(shape_id, num_edges);
      clipped->set_contains_center((header & 4) != 0);
      if (!DecodeEdges(num_edges, clipped, decoder)) return false;
    }
  }
  return true;
}